

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

uint64_t pmxevcntr_read(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri)

{
  uint64_t uVar1;
  uint uVar2;
  
  uVar1 = (env->cp15).c9_pmselr;
  uVar2 = (uint)uVar1;
  if ((uVar2 & 0x1f) < ((uint)(env->cp15).c9_pmcr >> 0xb & 0x1f)) {
    pmevcntr_op_start(env,(byte)uVar1 & 0x1f);
    uVar1 = (env->cp15).c14_pmevcntr[uVar2 & 0x1f];
  }
  else {
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

static uint64_t pmxevcntr_read(CPUARMState *env, const ARMCPRegInfo *ri)
{
    return pmevcntr_read(env, ri, env->cp15.c9_pmselr & 31);
}